

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memplumber.cpp
# Opt level: O3

void * __thiscall
MemPlumberInternal::allocateMemory(MemPlumberInternal *this,size_t size,char *file,int line)

{
  undefined8 *puVar1;
  int iVar2;
  undefined8 *puVar3;
  void *pvVar4;
  char *__format;
  long lVar5;
  ulong uVar6;
  
  iVar2 = this->m_ProgramStarted;
  if (iVar2 == 0) {
    lVar5 = 0x20000;
  }
  else {
    if (this->m_Started == false) {
      if (((FILE *)this->m_Dumper != (FILE *)0x0 & this->m_Verbose) == 1) {
        fwrite("Request for memory allocation before program started\n",0x35,1,
               (FILE *)this->m_Dumper);
      }
      pvVar4 = malloc(size);
      return pvVar4;
    }
    lVar5 = 0;
  }
  puVar3 = (undefined8 *)malloc(size + 0x78);
  puVar1 = puVar3 + 0xf;
  uVar6 = (ulong)((uint)((ulong)puVar1 >> 5) & 0x1fff8);
  *puVar3 = *(undefined8 *)((long)this->m_PointerListHashtable + uVar6 + lVar5);
  *(int *)((long)puVar3 + 0x6c) = line;
  puVar3[0xe] = size;
  strncpy((char *)(puVar3 + 1),file,99);
  *(undefined1 *)((long)puVar3 + 0x6b) = 0;
  *(undefined8 **)((long)this->m_PointerListHashtable + uVar6 + lVar5) = puVar3;
  if (((FILE *)this->m_Dumper != (FILE *)0x0 & this->m_Verbose) == 1) {
    if (iVar2 == 0) {
      __format = "Allocate static variable: %d[bytes] in 0x%p in %s:%d\n";
    }
    else {
      __format = "Allocate: %d[bytes] in 0x%p in %s:%d\n";
    }
    fprintf((FILE *)this->m_Dumper,__format,size,puVar1,file,(ulong)(uint)line);
  }
  return puVar1;
}

Assistant:

void* allocateMemory(std::size_t size, const char* file, int line) {

        // if not started, allocate memory and exit
        if (m_ProgramStarted != 0 && !m_Started) {
            if (isVerbose()) {
                fprintf(m_Dumper, "Request for memory allocation before program started\n");
            }
            return malloc(size);
        }

        // total memory to allocated is the requested size + metadata size
        size_t totalSizeToAllocate = size + sizeof(new_ptr_list_t);

        // allocated memory
        new_ptr_list_t* pointerMetaDataRecord = (new_ptr_list_t*)malloc(totalSizeToAllocate);
        memset(pointerMetaDataRecord, 0, sizeof(new_ptr_list_t));

        // if cannot allocate, return NULL
        if (pointerMetaDataRecord == NULL)
            return pointerMetaDataRecord;
        
        // calculate the actual pointer to provide to the user
        void* actualPointer = (char*)pointerMetaDataRecord + sizeof(new_ptr_list_t);

        // find the hash index for this pointer
        size_t hashIndex = MEMPLUMBER_HASH(actualPointer);

        new_ptr_list_t** hashtable = (m_ProgramStarted == 0 ? m_StaticPointerListHashtable : m_PointerListHashtable);

        // chain this metadata to the linked list of the specific bucket 
        pointerMetaDataRecord->next = hashtable[hashIndex];

        // fill in the metadata
        pointerMetaDataRecord->line = line;
        pointerMetaDataRecord->size = size;
        strncpy(pointerMetaDataRecord->file, file, MEMPLUMBER_FILENAME_LEN - 1);
		pointerMetaDataRecord->file[MEMPLUMBER_FILENAME_LEN - 1] = '\0';

        // put this metadata in the head of the list
        hashtable[hashIndex] = pointerMetaDataRecord;

        if (isVerbose()) {
            if (m_ProgramStarted == 0) {
                fprintf(m_Dumper, "Allocate static variable: %d[bytes] in 0x%p in %s:%d\n", (int)size, actualPointer, file, line);
            } else {
                fprintf(m_Dumper, "Allocate: %d[bytes] in 0x%p in %s:%d\n", (int)size, actualPointer, file, line);
            }
        }

        return actualPointer;
    }